

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O2

wchar_t process_base_block(archive_read *a,archive_entry *entry)

{
  undefined1 *puVar1;
  ulong how_many;
  byte bVar2;
  uint uVar3;
  rar5 *rar;
  char cVar4;
  wchar_t wVar5;
  uint32_t uVar6;
  wchar_t wVar7;
  uint64_t *puVar8;
  uint64_t uVar9;
  char *pcVar10;
  long lVar11;
  uint64_t locator_flags;
  uint64_t extra_data_size;
  uint32_t hdr_crc;
  size_t header_flags;
  size_t header_id;
  size_t hdr_size_len;
  size_t raw_hdr_size;
  size_t archive_flags;
  size_t extra_field_id;
  size_t extra_field_size;
  uint8_t *p;
  
  rar = (rar5 *)a->format->data;
  raw_hdr_size = 0;
  header_id = 0;
  header_flags = 0;
  lVar11 = (rar->file).bytes_remaining;
  if (lVar11 != 0) {
    if (rar->merge_mode == L'\0') {
      wVar5 = rar5_read_data_skip(a);
      if (wVar5 != L'\0') {
        return wVar5;
      }
    }
    else {
      wVar5 = consume(a,lVar11);
      if (wVar5 != L'\0') {
        return wVar5;
      }
      (rar->file).bytes_remaining = 0;
    }
  }
  cVar4 = read_u32(a,&hdr_crc);
  if (cVar4 == '\0') {
    return L'\x01';
  }
  wVar5 = read_var_sized(a,&raw_hdr_size,&hdr_size_len);
  if (wVar5 == L'\0') {
    return L'\x01';
  }
  how_many = hdr_size_len + raw_hdr_size;
  if (0x200000 < how_many) {
    pcVar10 = "Base block header is too large";
    goto LAB_001306ed;
  }
  if ((hdr_size_len == 0 || raw_hdr_size == 0) || how_many < 3) {
    pcVar10 = "Too small block encountered (%zu bytes)";
LAB_0013071c:
    archive_set_error(&a->archive,0x54,pcVar10);
    goto LAB_00130729;
  }
  wVar5 = read_ahead(a,how_many,&p);
  if (wVar5 == L'\0') {
    return L'\x01';
  }
  uVar6 = crc32(0,p,how_many & 0xffffffff);
  if (hdr_crc != uVar6) {
    pcVar10 = "Header CRC error";
    goto LAB_001306ed;
  }
  wVar5 = consume(a,hdr_size_len);
  if (wVar5 != L'\0') {
    return L'\x01';
  }
  wVar5 = read_var_sized(a,&header_id,(size_t *)0x0);
  if (wVar5 == L'\0') {
    return L'\x01';
  }
  wVar5 = read_var_sized(a,&header_flags,(size_t *)0x0);
  if (wVar5 == L'\0') {
    return L'\x01';
  }
  bVar2 = *(byte *)&rar->main;
  *(byte *)&rar->generic =
       (byte)((header_flags & 0xffffffff) >> 2) & 2 |
       *(byte *)&rar->generic & 0xfc | (byte)((header_flags & 0xffffffff) >> 4) & 1;
  (rar->generic).size = (wchar_t)how_many;
  (rar->generic).last_header_id = (wchar_t)header_id;
  *(byte *)&rar->main = bVar2 & 0xfb;
  wVar5 = L'\x01';
  switch(header_id) {
  case 0:
    break;
  case 1:
    extra_data_size = 0;
    extra_field_size = 0;
    extra_field_id = 0;
    archive_flags = 0;
    if ((header_flags & 1) == 0) {
      extra_data_size = 0;
    }
    else {
      wVar5 = read_var(a,&extra_data_size,(uint64_t *)0x0);
      if (wVar5 == L'\0') {
        return L'\x01';
      }
    }
    wVar5 = read_var_sized(a,&archive_flags,(size_t *)0x0);
    if (wVar5 == L'\0') {
      return L'\x01';
    }
    *(byte *)&rar->main =
         (byte)archive_flags >> 2 & 1 |
         *(byte *)&rar->main & 0xfc | (byte)archive_flags * '\x02' & 2;
    if ((archive_flags & 2) == 0) {
      (rar->main).vol_no = 0;
      uVar9 = 0;
    }
    else {
      locator_flags = 0;
      wVar5 = read_var_sized(a,&locator_flags,(size_t *)0x0);
      if (wVar5 == L'\0') {
        return L'\x01';
      }
      if (locator_flags >> 0x20 != 0) {
        pcVar10 = "Invalid volume number";
        goto LAB_001306ed;
      }
      (rar->main).vol_no = (uint)locator_flags;
      uVar9 = locator_flags;
    }
    uVar3 = (rar->vol).expected_vol_no;
    if ((uint)uVar9 != uVar3 && uVar3 != 0) {
      return L'\x01';
    }
    if (extra_data_size != 0) {
      wVar5 = read_var_sized(a,&extra_field_size,(size_t *)0x0);
      if (wVar5 == L'\0') {
        return L'\x01';
      }
      wVar5 = read_var_sized(a,&extra_field_id,(size_t *)0x0);
      if (wVar5 == L'\0') {
        return L'\x01';
      }
      if (extra_field_size == 0) {
        pcVar10 = "Invalid extra field size";
        goto LAB_001306ed;
      }
      if (extra_field_id != 1) {
        pcVar10 = "Unsupported extra type (0x%jx)";
        goto LAB_0013071c;
      }
      wVar5 = read_var(a,&locator_flags,(uint64_t *)0x0);
      if (((wVar5 == L'\0') ||
          (((locator_flags & 1) != 0 &&
           (wVar5 = read_var(a,&rar->qlist_offset,(uint64_t *)0x0), wVar5 == L'\0')))) ||
         (((locator_flags & 2) != 0 &&
          (wVar5 = read_var(a,&rar->rr_offset,(uint64_t *)0x0), wVar5 == L'\0')))) {
        return L'\x01';
      }
    }
    goto LAB_00130ab6;
  case 2:
    wVar5 = process_head_file(a,rar,entry,header_flags);
    break;
  case 3:
    wVar5 = process_head_file(a,rar,entry,header_flags);
    if (wVar5 == L'\0') {
      puVar1 = &(rar->file).field_0x20;
      *puVar1 = *puVar1 | 2;
      wVar7 = rar5_read_data_skip(a);
      wVar5 = L'\xfffffff6';
      if (wVar7 != L'\0') {
        wVar5 = wVar7;
      }
    }
    break;
  case 4:
    archive_entry_set_is_metadata_encrypted(entry,'\x01');
    archive_entry_set_is_data_encrypted(entry,'\x01');
    rar->has_encrypted_entries = L'\x01';
    rar->headers_are_encrypted = L'\x01';
    pcVar10 = "Encryption is not supported";
    goto LAB_001306ed;
  case 5:
    *(byte *)&rar->main = bVar2 | 4;
    if ((bVar2 & 2) == 0) {
      return L'\x01';
    }
    rar5_signature((char *)&extra_data_size);
    while (wVar5 = read_ahead(a,0x200,(uint8_t **)&locator_flags),
          puVar8 = (uint64_t *)locator_flags, lVar11 = -8, wVar5 != L'\0') {
      for (; lVar11 != -0x200; lVar11 = lVar11 + -1) {
        if (*puVar8 == extra_data_size) {
          consume(a,-lVar11);
          goto LAB_0013099f;
        }
        puVar8 = (uint64_t *)((long)puVar8 + 1);
      }
      consume(a,0x200);
    }
LAB_0013099f:
    if ((rar->vol).expected_vol_no != 0xffffffff) {
      (rar->vol).expected_vol_no = (rar->main).vol_no + 1;
      return L'\0';
    }
    pcVar10 = "Header error";
LAB_001306ed:
    archive_set_error(&a->archive,0x54,pcVar10);
LAB_00130729:
    wVar5 = L'\xffffffe2';
    break;
  default:
    if ((header_flags & 4) == 0) {
      pcVar10 = "Header type error";
      goto LAB_001306ed;
    }
LAB_00130ab6:
    wVar5 = L'\xfffffff6';
  }
  return wVar5;
}

Assistant:

static int process_base_block(struct archive_read* a,
    struct archive_entry* entry)
{
	const size_t SMALLEST_RAR5_BLOCK_SIZE = 3;

	struct rar5* rar = get_context(a);
	uint32_t hdr_crc, computed_crc;
	size_t raw_hdr_size = 0, hdr_size_len, hdr_size;
	size_t header_id = 0;
	size_t header_flags = 0;
	const uint8_t* p;
	int ret;

	enum HEADER_TYPE {
		HEAD_MARK    = 0x00, HEAD_MAIN  = 0x01, HEAD_FILE   = 0x02,
		HEAD_SERVICE = 0x03, HEAD_CRYPT = 0x04, HEAD_ENDARC = 0x05,
		HEAD_UNKNOWN = 0xff,
	};

	/* Skip any unprocessed data for this file. */
	ret = skip_unprocessed_bytes(a);
	if(ret != ARCHIVE_OK)
		return ret;

	/* Read the expected CRC32 checksum. */
	if(!read_u32(a, &hdr_crc)) {
		return ARCHIVE_EOF;
	}

	/* Read header size. */
	if(!read_var_sized(a, &raw_hdr_size, &hdr_size_len)) {
		return ARCHIVE_EOF;
	}

	hdr_size = raw_hdr_size + hdr_size_len;

	/* Sanity check, maximum header size for RAR5 is 2MB. */
	if(hdr_size > (2 * 1024 * 1024)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Base block header is too large");

		return ARCHIVE_FATAL;
	}

	/* Additional sanity checks to weed out invalid files. */
	if(raw_hdr_size == 0 || hdr_size_len == 0 ||
		hdr_size < SMALLEST_RAR5_BLOCK_SIZE)
	{
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Too small block encountered (%zu bytes)",
		    raw_hdr_size);

		return ARCHIVE_FATAL;
	}

	/* Read the whole header data into memory, maximum memory use here is
	 * 2MB. */
	if(!read_ahead(a, hdr_size, &p)) {
		return ARCHIVE_EOF;
	}

	/* Verify the CRC32 of the header data. */
	computed_crc = (uint32_t) crc32(0, p, (int) hdr_size);
	if(computed_crc != hdr_crc) {
#ifndef DONT_FAIL_ON_CRC_ERROR
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Header CRC error");

		return ARCHIVE_FATAL;
#endif
	}

	/* If the checksum is OK, we proceed with parsing. */
	if(ARCHIVE_OK != consume(a, hdr_size_len)) {
		return ARCHIVE_EOF;
	}

	if(!read_var_sized(a, &header_id, NULL))
		return ARCHIVE_EOF;

	if(!read_var_sized(a, &header_flags, NULL))
		return ARCHIVE_EOF;

	rar->generic.split_after = (header_flags & HFL_SPLIT_AFTER) > 0;
	rar->generic.split_before = (header_flags & HFL_SPLIT_BEFORE) > 0;
	rar->generic.size = (int)hdr_size;
	rar->generic.last_header_id = (int)header_id;
	rar->main.endarc = 0;

	/* Those are possible header ids in RARv5. */
	switch(header_id) {
		case HEAD_MAIN:
			ret = process_head_main(a, rar, entry, header_flags);

			/* Main header doesn't have any files in it, so it's
			 * pointless to return to the caller. Retry to next
			 * header, which should be HEAD_FILE/HEAD_SERVICE. */
			if(ret == ARCHIVE_OK)
				return ARCHIVE_RETRY;

			return ret;
		case HEAD_SERVICE:
			ret = process_head_service(a, rar, entry, header_flags);
			return ret;
		case HEAD_FILE:
			ret = process_head_file(a, rar, entry, header_flags);
			return ret;
		case HEAD_CRYPT:
			archive_entry_set_is_metadata_encrypted(entry, 1);
			archive_entry_set_is_data_encrypted(entry, 1);
			rar->has_encrypted_entries = 1;
			rar->headers_are_encrypted = 1;
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Encryption is not supported");
			return ARCHIVE_FATAL;
		case HEAD_ENDARC:
			rar->main.endarc = 1;

			/* After encountering an end of file marker, we need
			 * to take into consideration if this archive is
			 * continued in another file (i.e. is it part01.rar:
			 * is there a part02.rar?) */
			if(rar->main.volume) {
				/* In case there is part02.rar, position the
				 * read pointer in a proper place, so we can
				 * resume parsing. */
				ret = scan_for_signature(a);
				if(ret == ARCHIVE_FATAL) {
					return ARCHIVE_EOF;
				} else {
					if(rar->vol.expected_vol_no ==
					    UINT_MAX) {
						archive_set_error(&a->archive,
						    ARCHIVE_ERRNO_FILE_FORMAT,
						    "Header error");
							return ARCHIVE_FATAL;
					}

					rar->vol.expected_vol_no =
					    rar->main.vol_no + 1;
					return ARCHIVE_OK;
				}
			} else {
				return ARCHIVE_EOF;
			}
		case HEAD_MARK:
			return ARCHIVE_EOF;
		default:
			if((header_flags & HFL_SKIP_IF_UNKNOWN) == 0) {
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_FILE_FORMAT,
				    "Header type error");
				return ARCHIVE_FATAL;
			} else {
				/* If the block is marked as 'skip if unknown',
				 * do as the flag says: skip the block
				 * instead on failing on it. */
				return ARCHIVE_RETRY;
			}
	}

#if !defined WIN32
	// Not reached.
	archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
	    "Internal unpacker error");
	return ARCHIVE_FATAL;
#endif
}